

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp.cpp
# Opt level: O0

void __thiscall pg::PPSolver::printState(PPSolver *this)

{
  int iVar1;
  vector<int,_std::allocator<int>_> *pvVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  ostream *poVar10;
  iterator __first;
  iterator __last;
  size_type sVar11;
  reference pvVar12;
  reference piVar13;
  int *piStack_e0;
  int to_4;
  int *curedge_4;
  int *piStack_d0;
  int to_3;
  int *curedge_3;
  bool nodeclosed;
  iterator iStack_c0;
  int j_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<int,_std::allocator<int>_> *__range2_1;
  bool empty;
  bool subclosed;
  bool fullclosed;
  uint k;
  int *piStack_88;
  int to_2;
  int *curedge_2;
  int *piStack_78;
  int to_1;
  int *curedge_1;
  int *piStack_68;
  int to;
  int *curedge;
  bool escapes;
  iterator iStack_48;
  int j;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  vector<int,_std::allocator<int>_> exits;
  int p;
  int i;
  PPSolver *this_local;
  
  lVar9 = Solver::nodecount(&this->super_Solver);
  exits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = (int)lVar9;
  do {
    do {
      exits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ =
           exits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._4_4_ + -1;
      if (exits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_ < 0) {
        return;
      }
    } while ((this->region
              [exits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage._4_4_] == -2) ||
            (exits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage._0_4_ =
                  Solver::priority(&this->super_Solver,
                                   exits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage._4_4_),
            this->region
            [exits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage._4_4_] !=
            (uint)exits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage));
    poVar10 = std::operator<<((this->super_Solver).logger,"\x1b[1;34m|| \x1b[1;37m");
    poVar10 = (ostream *)
              std::ostream::operator<<
                        (poVar10,(uint)exits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage);
    std::operator<<(poVar10,"\x1b[m (");
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&__range2);
    pvVar2 = this->regions;
    lVar9 = (long)(int)(uint)exits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
    __end2 = std::vector<int,_std::allocator<int>_>::begin(pvVar2 + lVar9);
    iStack_48 = std::vector<int,_std::allocator<int>_>::end(pvVar2 + lVar9);
    while (bVar5 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffb8), bVar5) {
      piVar13 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&__end2);
      iVar1 = *piVar13;
      poVar10 = std::operator<<((this->super_Solver).logger,"\x1b[1m");
      iVar8 = Solver::priority(&this->super_Solver,iVar1);
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar8);
      std::operator<<(poVar10,"\x1b[m ");
      uVar7 = Solver::owner(&this->super_Solver,iVar1);
      if (uVar7 == ((uint)exits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage & 1)) {
        bVar5 = true;
        for (piStack_68 = Solver::outs(&this->super_Solver,iVar1); *piStack_68 != -1;
            piStack_68 = piStack_68 + 1) {
          if ((this->region[*piStack_68] != -2) &&
             (this->region[*piStack_68] ==
              (uint)exits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage)) {
            bVar5 = false;
            break;
          }
        }
        if (bVar5) {
          for (piStack_78 = Solver::outs(&this->super_Solver,iVar1); *piStack_78 != -1;
              piStack_78 = piStack_78 + 1) {
            iVar1 = *piStack_78;
            if (this->region[iVar1] != -2) {
              poVar10 = std::operator<<((this->super_Solver).logger,"\x1b[m");
              poVar10 = (ostream *)std::ostream::operator<<(poVar10,this->region[iVar1]);
              std::operator<<(poVar10,"\x1b[m ");
              if (this->region[iVar1] !=
                  (uint)exits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,_std::allocator<int>_>::push_back
                          ((vector<int,_std::allocator<int>_> *)&__range2,this->region + iVar1);
              }
            }
          }
        }
      }
      else {
        for (piStack_88 = Solver::outs(&this->super_Solver,iVar1); *piStack_88 != -1;
            piStack_88 = piStack_88 + 1) {
          iVar1 = *piStack_88;
          if (this->region[iVar1] != -2) {
            poVar10 = std::operator<<((this->super_Solver).logger,"\x1b[m");
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,this->region[iVar1]);
            std::operator<<(poVar10,"\x1b[m ");
            if (this->region[iVar1] !=
                (uint)exits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)&__range2,this->region + iVar1);
            }
          }
        }
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2);
    }
    bVar5 = std::vector<int,_std::allocator<int>_>::empty
                      (this->regions +
                       (int)(uint)exits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage);
    if (!bVar5) {
      std::operator<<((this->super_Solver).logger,"\b");
    }
    std::operator<<((this->super_Solver).logger,") => {");
    __first = std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)&__range2);
    __last = std::vector<int,_std::allocator<int>_>::end
                       ((vector<int,_std::allocator<int>_> *)&__range2);
    std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first._M_current
               ,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__last._M_current
              );
    for (__range2_1._4_4_ = 0;
        sVar11 = std::vector<int,_std::allocator<int>_>::size
                           ((vector<int,_std::allocator<int>_> *)&__range2),
        __range2_1._4_4_ < sVar11; __range2_1._4_4_ = __range2_1._4_4_ + 1) {
      if (__range2_1._4_4_ == 0) {
LAB_001dc7f3:
        poVar10 = (this->super_Solver).logger;
        pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)&__range2,(ulong)__range2_1._4_4_)
        ;
        std::ostream::operator<<(poVar10,*pvVar12);
      }
      else {
        pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)&__range2,
                             (ulong)(__range2_1._4_4_ - 1));
        iVar1 = *pvVar12;
        pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)&__range2,(ulong)__range2_1._4_4_)
        ;
        if (iVar1 != *pvVar12) {
          std::operator<<((this->super_Solver).logger,", ");
          goto LAB_001dc7f3;
        }
      }
    }
    std::operator<<((this->super_Solver).logger,"}");
    bVar3 = true;
    bVar4 = true;
    bVar5 = true;
    pvVar2 = this->regions;
    lVar9 = (long)(int)(uint)exits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
    __end2_1 = std::vector<int,_std::allocator<int>_>::begin(pvVar2 + lVar9);
    iStack_c0 = std::vector<int,_std::allocator<int>_>::end(pvVar2 + lVar9);
    while (bVar6 = __gnu_cxx::operator!=(&__end2_1,&stack0xffffffffffffff40), bVar6) {
      piVar13 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&__end2_1);
      iVar1 = *piVar13;
      bVar5 = false;
      iVar8 = Solver::owner(&this->super_Solver,iVar1);
      if (iVar8 == (int)(uint)exits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage % 2) {
        bVar6 = false;
        for (piStack_d0 = Solver::outs(&this->super_Solver,iVar1); *piStack_d0 != -1;
            piStack_d0 = piStack_d0 + 1) {
          if (this->region[*piStack_d0] ==
              (uint)exits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
            bVar6 = true;
          }
          if (bVar6) break;
        }
        if (!bVar6) {
          bVar4 = false;
          bVar3 = false;
        }
      }
      else {
        for (piStack_e0 = Solver::outs(&this->super_Solver,iVar1); *piStack_e0 != -1;
            piStack_e0 = piStack_e0 + 1) {
          iVar1 = *piStack_e0;
          if (this->region[iVar1] != -2) {
            if ((this->region[iVar1] !=
                 (uint)exits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage) &&
               (bVar3 = false,
               this->region[iVar1] <
               (int)(uint)exits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage)) {
              bVar4 = false;
            }
            if (!bVar4) break;
          }
        }
      }
      if (!bVar4) break;
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2_1);
    }
    if (!bVar5) {
      if (bVar3) {
        std::operator<<((this->super_Solver).logger," (dominion)");
      }
      else if (bVar4) {
        poVar10 = std::operator<<((this->super_Solver).logger," (closed to ");
        pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)&__range2,0);
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,*pvVar12);
        std::operator<<(poVar10,")");
      }
    }
    std::operator<<((this->super_Solver).logger,"\x1b[m");
    std::ostream::operator<<((this->super_Solver).logger,std::endl<char,std::char_traits<char>>);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&__range2);
  } while( true );
}

Assistant:

void
PPSolver::printState()
{
    for (int i = nodecount()-1; i>=0; i--) {
        if (region[i] == -2) continue;
        int p = priority(i);
        if (region[i] != p) continue;

        logger << "\033[1;34m|| \033[1;37m" << p << "\033[m (";

        std::vector<int> exits;
        for (int j : regions[p]) {
            logger << "\033[1m" << priority(j) << "\033[m ";
            if (owner(j) == (p&1)) {
                bool escapes = true;
                for (auto curedge = outs(j); *curedge != -1; curedge++) {
                    int to = *curedge;
                    if (region[to] == -2) continue;
                    if (region[to] == p) {
                        escapes = false;
                        break;
                    }
                }
                if (escapes) {
                    for (auto curedge = outs(j); *curedge != -1; curedge++) {
                        int to = *curedge;
                        if (region[to] == -2) continue;
                        logger << "\033[m" << region[to] << "\033[m ";
                        if (region[to] != p) exits.push_back(region[to]);
                    }
                }
            } else {
                for (auto curedge = outs(j); *curedge != -1; curedge++) {
                    int to = *curedge;
                    if (region[to] == -2) continue;
                    logger << "\033[m" << region[to] << "\033[m ";
                    if (region[to] != p) exits.push_back(region[to]);
                }
            }
        }

        if (!regions[p].empty()) logger << "\b";
        logger << ") => {";

        std::sort(exits.begin(), exits.end());
        for (unsigned k=0; k<exits.size(); k++) {
            if (k > 0) {
                if (exits[k-1] == exits[k]) continue;
                logger << ", ";
            }
            logger << exits[k];
        }
        logger << "}";

        // check if the region is closed
        bool fullclosed = true;
        bool subclosed = true;
        bool empty = true;
        for (int j : regions[p]) {
            empty = false;
            if (owner(j) == p%2) {
                // node won by escape owner
                // it is therefore closed if it has an edge to itself
                bool nodeclosed = false;
                for (auto curedge = outs(j); *curedge != -1; curedge++) {
                    int to = *curedge;
                    if (region[to] == p) nodeclosed = true;
                    if (nodeclosed) break;
                }
                if (!nodeclosed) fullclosed = subclosed = false;
            } else {
                // region lost by escape owner
                // it is therefore closed if there are no edges to lower regions
                for (auto curedge = outs(j); *curedge != -1; curedge++) {
                    int to = *curedge;
                    if (region[to] == -2) continue;
                    if (region[to] != p) {
                        fullclosed = false;
                        if (region[to] < p) subclosed = false;
                    }
                    if (!subclosed) break;
                }
            }
            if (!subclosed) break;
        }

        if (empty) {} 
        else if (fullclosed) logger << " (dominion)";
        else if (subclosed) logger << " (closed to " << exits[0] << ")";
        logger << "\033[m";
        logger << std::endl;
    }
}